

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::Buffer::Buffer
          (Buffer *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkBufferCreateInfo *bufferCreateInfo,MemoryRequirement memoryRequirement)

{
  undefined8 uVar1;
  Handle<(vk::HandleType)8> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  undefined1 local_78 [16];
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_58;
  
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_58,vk,device,bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  pVVar5 = local_58.m_data.deleter.m_allocator;
  pVVar4 = local_58.m_data.deleter.m_device;
  pDVar3 = local_58.m_data.deleter.m_deviceIface;
  HVar2.m_internal = local_58.m_data.object.m_internal;
  local_68 = local_58.m_data.deleter.m_device;
  pVStack_60 = local_58.m_data.deleter.m_allocator;
  local_78._0_8_ = local_58.m_data.object.m_internal;
  local_78._8_8_ = local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = pVVar4;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator = pVVar5
  ;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       HVar2.m_internal;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       pDVar3;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_58);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78,vk,device,
             allocator,
             (VkBuffer)
             (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,memoryRequirement);
  uVar1 = local_78._0_8_;
  local_78._0_8_ = (Allocation *)0x0;
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)uVar1;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78);
  return;
}

Assistant:

Buffer::Buffer (const vk::DeviceInterface&		vk,
				const vk::VkDevice				device,
				vk::Allocator&					allocator,
				const vk::VkBufferCreateInfo&	bufferCreateInfo,
				const vk::MemoryRequirement		memoryRequirement)
	: m_buffer		(createBuffer(vk, device, &bufferCreateInfo))
	, m_allocation	(bindBuffer(vk, device, allocator, *m_buffer, memoryRequirement))
{
}